

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O0

void __thiscall btGeneric6DofConstraint::calcAnchorPos(btGeneric6DofConstraint *this)

{
  long in_RDI;
  btVector3 bVar1;
  btVector3 *pB;
  btVector3 *pA;
  btScalar weight;
  btScalar imB;
  btScalar imA;
  undefined1 in_stack_ffffffffffffffa8 [16];
  undefined8 local_38;
  undefined8 local_30;
  
  btRigidBody::getInvMass(*(btRigidBody **)(in_RDI + 0x28));
  btRigidBody::getInvMass(*(btRigidBody **)(in_RDI + 0x30));
  btTransform::getOrigin((btTransform *)(in_RDI + 0x440));
  btTransform::getOrigin((btTransform *)(in_RDI + 0x480));
  ::operator*(in_stack_ffffffffffffffa8._8_8_,in_stack_ffffffffffffffa8._0_8_);
  bVar1 = ::operator*(in_stack_ffffffffffffffa8._8_8_,in_stack_ffffffffffffffa8._0_8_);
  bVar1 = operator+(bVar1.m_floats._8_8_,bVar1.m_floats._0_8_);
  local_38 = bVar1.m_floats._0_8_;
  *(undefined8 *)(in_RDI + 0x51c) = local_38;
  local_30 = bVar1.m_floats._8_8_;
  *(undefined8 *)(in_RDI + 0x524) = local_30;
  return;
}

Assistant:

void btGeneric6DofConstraint::calcAnchorPos(void)
{
	btScalar imA = m_rbA.getInvMass();
	btScalar imB = m_rbB.getInvMass();
	btScalar weight;
	if(imB == btScalar(0.0))
	{
		weight = btScalar(1.0);
	}
	else
	{
		weight = imA / (imA + imB);
	}
	const btVector3& pA = m_calculatedTransformA.getOrigin();
	const btVector3& pB = m_calculatedTransformB.getOrigin();
	m_AnchorPos = pA * weight + pB * (btScalar(1.0) - weight);
	return;
}